

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_expr.hpp
# Opt level: O1

void __thiscall
viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>>::
rt_binary_expr<1ul,viennamath::op_mult<double>,1ul>
          (rt_binary_expr<viennamath::rt_expression_interface<double>> *this,
          ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<1UL>_>
          *param_1)

{
  long *plVar1;
  undefined8 *puVar2;
  long *plVar3;
  
  *(undefined ***)this = &PTR__rt_binary_expr_00112840;
  *(undefined8 *)(this + 8) = 0;
  puVar2 = (undefined8 *)operator_new(8);
  *puVar2 = &PTR__op_interface_001129c0;
  *(undefined8 **)(this + 0x10) = puVar2;
  *(undefined8 *)(this + 0x18) = 0;
  puVar2 = (undefined8 *)operator_new(0x10);
  *puVar2 = &PTR__rt_expression_interface_00112be0;
  puVar2[1] = 1;
  *(undefined8 **)(this + 8) = puVar2;
  plVar3 = (long *)operator_new(0x10);
  *plVar3 = (long)&PTR__rt_expression_interface_00112be0;
  plVar3[1] = 1;
  plVar1 = *(long **)(this + 0x18);
  if (plVar1 != plVar3) {
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
    *(long **)(this + 0x18) = plVar3;
  }
  return;
}

Assistant:

explicit rt_binary_expr(ct_binary_expr<ct_variable<id1>, OP, ct_variable<id2> > const & /*other*/) : op_(new op_binary<OP, InterfaceType>())
      {
        //std::cout << "Constructing from expression " << other << " to " << OP::apply(value1, value2) << std::endl;
        lhs_ = std::auto_ptr<InterfaceType>(new rt_variable<InterfaceType>(id1));
        rhs_ = std::auto_ptr<InterfaceType>(new rt_variable<InterfaceType>(id2));
      }